

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O3

string * __thiscall cli::Parser::usage_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  pointer ppCVar1;
  size_type *psVar2;
  size_type sVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer ppCVar7;
  stringstream ss;
  size_type *local_200;
  size_type local_1f0;
  undefined8 uStack_1e8;
  string *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->_general_help_text)._M_dataplus._M_p,
                      (this->_general_help_text)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Available parameters:\n\n",0x17);
  ppCVar1 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar7 = (this->_commands).
                 super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar7 != ppCVar1;
      ppCVar7 = ppCVar7 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"  ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,((*ppCVar7)->command)._M_dataplus._M_p,
                        ((*ppCVar7)->command)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,((*ppCVar7)->alternative)._M_dataplus._M_p,
               ((*ppCVar7)->alternative)._M_string_length);
    if ((*ppCVar7)->required == true) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t(required)",0xb);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,((*ppCVar7)->description)._M_dataplus._M_p,
               ((*ppCVar7)->description)._M_string_length);
    if ((*ppCVar7)->required == false) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n   ",4);
      (*(*ppCVar7)->_vptr_CmdBase[2])(&local_1d8);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_1d8,0,0,"This parameter is optional. The default value is \'",0x32);
      local_200 = &local_1f0;
      psVar2 = (size_type *)(pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2 == paVar6) {
        local_1f0 = paVar6->_M_allocated_capacity;
        uStack_1e8 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        local_1f0 = paVar6->_M_allocated_capacity;
        local_200 = psVar2;
      }
      sVar3 = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,sVar3)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'.",2);
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n\n",2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_1e0;
}

Assistant:

std::string usage() const {
			std::stringstream ss { };
			ss << _general_help_text << "\n\n";
			ss << "Available parameters:\n\n";

			for (const auto& command : _commands) {
				ss << "  " << command->command << "\t" << command->alternative;

				if (command->required == true) {
					ss << "\t(required)";
				}

				ss << "\n   " << command->description;

				if (command->required == false) {
					ss << "\n   " << "This parameter is optional. The default value is '" + command->print_value() << "'.";
				}

				ss << "\n\n";
			}

			return ss.str();
		}